

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

quath __thiscall tinyusdz::lerp<tinyusdz::value::quath>(tinyusdz *this,quath *a,quath *b,double t)

{
  ushort uVar1;
  half hVar2;
  half hVar3;
  half hVar4;
  half hVar5;
  uint uVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined8 in_XMM1_Qa;
  quatf qVar7;
  quatf af;
  quatf bf;
  quatf local_58;
  quatf local_48;
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  
  uVar6 = (uint)*(ushort *)(this + 6) << 0xd;
  if ((uVar6 & 0xf800000) == 0xf800000) {
    local_58.real = (float)(uVar6 | 0x70000000);
  }
  else if ((uVar6 & 0xf800000) == 0) {
    local_58.real = (float)(uVar6 | 0x38800000) + -6.1035156e-05;
    in_XMM1_Qa = 0;
  }
  else {
    local_58.real = (float)((uVar6 & 0xfffe000) + 0x38000000);
  }
  local_58.real = (float)((int)(short)*(ushort *)(this + 6) & 0x80000000U | (uint)local_58.real);
  uVar6 = (uint)*(ushort *)this << 0xd;
  if ((uVar6 & 0xf800000) == 0xf800000) {
    local_58.imag._M_elems[0] = (float)(uVar6 | 0x70000000);
  }
  else if ((uVar6 & 0xf800000) == 0) {
    local_58.imag._M_elems[0] = (float)(uVar6 | 0x38800000) + -6.1035156e-05;
    in_XMM1_Qa = 0;
  }
  else {
    local_58.imag._M_elems[0] = (float)((uVar6 & 0xfffe000) + 0x38000000);
  }
  local_58.imag._M_elems[0] =
       (float)((int)(short)*(ushort *)this & 0x80000000U | (uint)local_58.imag._M_elems[0]);
  uVar6 = (uint)*(ushort *)(this + 2) << 0xd;
  if ((uVar6 & 0xf800000) == 0xf800000) {
    local_58.imag._M_elems[1] = (float)(uVar6 | 0x70000000);
  }
  else if ((uVar6 & 0xf800000) == 0) {
    local_58.imag._M_elems[1] = (float)(uVar6 | 0x38800000) + -6.1035156e-05;
    in_XMM1_Qa = 0;
  }
  else {
    local_58.imag._M_elems[1] = (float)((uVar6 & 0xfffe000) + 0x38000000);
  }
  local_58.imag._M_elems[1] =
       (float)((int)(short)*(ushort *)(this + 2) & 0x80000000U | (uint)local_58.imag._M_elems[1]);
  uVar6 = (uint)*(ushort *)(this + 4) << 0xd;
  if ((uVar6 & 0xf800000) == 0xf800000) {
    local_58.imag._M_elems[2] = (float)(uVar6 | 0x70000000);
  }
  else if ((uVar6 & 0xf800000) == 0) {
    local_58.imag._M_elems[2] = (float)(uVar6 | 0x38800000) + -6.1035156e-05;
    in_XMM1_Qa = 0;
  }
  else {
    local_58.imag._M_elems[2] = (float)((uVar6 & 0xfffe000) + 0x38000000);
  }
  local_58.imag._M_elems[2] =
       (float)((int)(short)*(ushort *)(this + 4) & 0x80000000U | (uint)local_58.imag._M_elems[2]);
  uVar1 = (a->real).value;
  uVar6 = (uint)uVar1 << 0xd;
  if ((uVar6 & 0xf800000) == 0xf800000) {
    local_48.real = (float)(uVar6 | 0x70000000);
  }
  else if ((uVar6 & 0xf800000) == 0) {
    local_48.real = (float)(uVar6 | 0x38800000) + -6.1035156e-05;
    in_XMM1_Qa = 0;
  }
  else {
    local_48.real = (float)((uVar6 & 0xfffe000) + 0x38000000);
  }
  local_48.real = (float)((int)(short)uVar1 & 0x80000000U | (uint)local_48.real);
  uVar1 = (a->imag)._M_elems[0].value;
  uVar6 = (uint)uVar1 << 0xd;
  if ((uVar6 & 0xf800000) == 0xf800000) {
    local_48.imag._M_elems[0] = (float)(uVar6 | 0x70000000);
  }
  else if ((uVar6 & 0xf800000) == 0) {
    local_48.imag._M_elems[0] = (float)(uVar6 | 0x38800000) + -6.1035156e-05;
    in_XMM1_Qa = 0;
  }
  else {
    local_48.imag._M_elems[0] = (float)((uVar6 & 0xfffe000) + 0x38000000);
  }
  local_48.imag._M_elems[0] =
       (float)((int)(short)uVar1 & 0x80000000U | (uint)local_48.imag._M_elems[0]);
  uVar1 = (a->imag)._M_elems[1].value;
  uVar6 = (uint)uVar1 << 0xd;
  if ((uVar6 & 0xf800000) == 0xf800000) {
    local_48.imag._M_elems[1] = (float)(uVar6 | 0x70000000);
  }
  else if ((uVar6 & 0xf800000) == 0) {
    local_48.imag._M_elems[1] = (float)(uVar6 | 0x38800000) + -6.1035156e-05;
    in_XMM1_Qa = 0;
  }
  else {
    local_48.imag._M_elems[1] = (float)((uVar6 & 0xfffe000) + 0x38000000);
  }
  local_48.imag._M_elems[1] =
       (float)((int)(short)uVar1 & 0x80000000U | (uint)local_48.imag._M_elems[1]);
  uVar1 = (a->imag)._M_elems[2].value;
  uVar6 = (uint)uVar1 << 0xd;
  if ((uVar6 & 0xf800000) == 0xf800000) {
    local_48.imag._M_elems[2] = (float)(uVar6 | 0x70000000);
  }
  else if ((uVar6 & 0xf800000) == 0) {
    local_48.imag._M_elems[2] = (float)(uVar6 | 0x38800000) + -6.1035156e-05;
    in_XMM1_Qa = 0;
  }
  else {
    local_48.imag._M_elems[2] = (float)((uVar6 & 0xfffe000) + 0x38000000);
  }
  local_48.imag._M_elems[2] =
       (float)((int)(short)uVar1 & 0x80000000U | (uint)local_48.imag._M_elems[2]);
  qVar7 = slerp(&local_58,&local_48,(float)t);
  local_28 = qVar7._8_8_;
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = qVar7.imag._M_elems._0_8_;
  local_38._12_4_ = extraout_XMM0_Dd;
  uStack_20 = in_XMM1_Qa;
  hVar2 = value::float_to_half_full(qVar7.real);
  hVar3 = value::float_to_half_full((float)local_38._0_4_);
  hVar4 = value::float_to_half_full((float)local_38._4_4_);
  hVar5 = value::float_to_half_full((float)local_28);
  return (quath)((ulong)hVar3.value |
                (ulong)hVar4.value << 0x10 | (ulong)hVar5.value << 0x20 | (ulong)hVar2.value << 0x30
                );
}

Assistant:

inline value::quath lerp(const value::quath &a, const value::quath &b, const double t) {
  // to float.
  value::quatf af;
  value::quatf bf;
  af.real = half_to_float(a.real);
  af.imag[0] = half_to_float(a.imag[0]);
  af.imag[1] = half_to_float(a.imag[1]);
  af.imag[2] = half_to_float(a.imag[2]);

  bf.real = half_to_float(b.real);
  bf.imag[0] = half_to_float(b.imag[0]);
  bf.imag[1] = half_to_float(b.imag[1]);
  bf.imag[2] = half_to_float(b.imag[2]);

  value::quatf ret =  slerp(af, bf, float(t));
  value::quath h;
  h.real = value::float_to_half_full(ret.real);
  h.imag[0] = value::float_to_half_full(ret.imag[0]);
  h.imag[1] = value::float_to_half_full(ret.imag[1]);
  h.imag[2] = value::float_to_half_full(ret.imag[2]);

  return h;
}